

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

void __thiscall xemmai::t_lexer::f_read_indent(t_lexer *this)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  int iVar3;
  wint_t __wc;
  
  __wc = this->v_c;
  if (__wc != 10) {
    do {
      iVar3 = iswspace(__wc);
      if (iVar3 == 0) {
        return;
      }
      wVar1 = this->v_c;
      if ((this->v_indent).v_i == (this->v_indent).v_j) {
        t_stringer::f_grow(&this->v_indent);
      }
      pwVar2 = (this->v_indent).v_i;
      (this->v_indent).v_i = pwVar2 + 1;
      *pwVar2 = wVar1;
      f_get(this);
      __wc = this->v_c;
    } while (__wc != 10);
  }
  return;
}

Assistant:

void f_read_indent()
	{
		while (v_c != L'\n' && std::iswspace(v_c)) {
			v_indent << v_c;
			f_get();
		}
	}